

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescendentFontWriter.cpp
# Opt level: O2

void __thiscall
DescendentFontWriter::WriteWidths
          (DescendentFontWriter *this,UIntAndGlyphEncodingInfoVector *inEncodedGlyphs,
          DictionaryContext *inFontContext)

{
  pointer ppVar1;
  ushort inLastCID;
  pointer ppVar2;
  bool inAllWidthsSame;
  bool bVar3;
  unsigned_short local_6a;
  FT_Pos currentWidth;
  _List_node_base *local_58;
  FTPosList widthsList;
  
  ppVar2 = (inEncodedGlyphs->
           super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&widthsList;
  widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_prev = widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
            super__List_node_base._M_next;
  DictionaryContext::WriteKey(inFontContext,&scDW_abi_cxx11_);
  local_58 = (_List_node_base *)FreeTypeFaceWrapper::GetGlyphWidth(this->mFontInfo,ppVar2->first);
  DictionaryContext::WriteIntegerValue(inFontContext,(longlong)local_58);
  do {
    ppVar1 = ppVar2;
    ppVar2 = ppVar1 + 1;
    if (ppVar2 == (inEncodedGlyphs->
                  super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      inLastCID = 0;
      goto LAB_001ccdc6;
    }
    currentWidth = FreeTypeFaceWrapper::GetGlyphWidth(this->mFontInfo,ppVar2->first);
  } while ((_List_node_base *)currentWidth == local_58);
  std::__cxx11::list<long,_std::allocator<long>_>::push_back(&widthsList,&currentWidth);
  inLastCID = ppVar1[1].second.mEncodedCharacter;
LAB_001ccdc6:
  if (widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size != 0) {
    DictionaryContext::WriteKey(inFontContext,&scW_abi_cxx11_);
    ObjectsContext::StartArray(this->mObjectsContext);
    inAllWidthsSame = true;
    local_6a = inLastCID;
    while (ppVar1 = ppVar2, ppVar2 = ppVar1 + 1,
          ppVar2 != (inEncodedGlyphs->
                    super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
      currentWidth = FreeTypeFaceWrapper::GetGlyphWidth(this->mFontInfo,ppVar2->first);
      if ((_List_node_base *)currentWidth != local_58) {
        if (inLastCID + 1 == (uint)ppVar1[1].second.mEncodedCharacter) {
          bVar3 = widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
                  super__List_node_base._M_next[1]._M_next == (_List_node_base *)currentWidth;
          std::__cxx11::list<long,_std::allocator<long>_>::push_back(&widthsList,&currentWidth);
          inLastCID = inLastCID + 1;
          inAllWidthsSame = (bool)(inAllWidthsSame & bVar3);
        }
        else {
          WriteWidthsItem(this,inAllWidthsSame,&widthsList,local_6a,inLastCID);
          std::__cxx11::list<long,_std::allocator<long>_>::clear(&widthsList);
          std::__cxx11::list<long,_std::allocator<long>_>::push_back(&widthsList,&currentWidth);
          inLastCID = ppVar1[1].second.mEncodedCharacter;
          inAllWidthsSame = true;
          local_6a = inLastCID;
        }
      }
    }
    if (widthsList.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size != 0) {
      WriteWidthsItem(this,inAllWidthsSame,&widthsList,local_6a,inLastCID);
    }
    ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
  }
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear
            (&widthsList.super__List_base<long,_std::allocator<long>_>);
  return;
}

Assistant:

void DescendentFontWriter::WriteWidths(const UIntAndGlyphEncodingInfoVector& inEncodedGlyphs,
										  DictionaryContext* inFontContext)
{
	UIntAndGlyphEncodingInfoVector::const_iterator it = inEncodedGlyphs.begin(); // will be the 0 glyph
	FT_Pos defaultWidth;
	FTPosList widthsList;
	bool allWidthsSame = true;
	FT_Pos currentWidth;
	unsigned short firstCIDInList = 0;
	unsigned short previousCIDInList = 0;

	// DW
	inFontContext->WriteKey(scDW);
	defaultWidth = mFontInfo->GetGlyphWidth(it->first);
	inFontContext->WriteIntegerValue(defaultWidth);

	++it;

	// find the first which is not default width
	for(; it != inEncodedGlyphs.end();++it)
	{
		currentWidth =  mFontInfo->GetGlyphWidth(it->first);
		if(currentWidth != defaultWidth)
		{
			widthsList.push_back(currentWidth);
			firstCIDInList = it->second.mEncodedCharacter;
			previousCIDInList = it->second.mEncodedCharacter;
			break;
		}
	}

	if(widthsList.size() != 0)
	{
		++it; // promote the iterator, from the already recorded glyph

		// W
		inFontContext->WriteKey(scW);
		mObjectsContext->StartArray();

		for(; it != inEncodedGlyphs.end();++it)
		{
			currentWidth = mFontInfo->GetGlyphWidth(it->first);
            if(currentWidth != defaultWidth)
			{
				if(it->second.mEncodedCharacter == previousCIDInList + 1)
				{
					++previousCIDInList;
					allWidthsSame &= (widthsList.front() == currentWidth);
					widthsList.push_back(currentWidth);
				}
				else
				{
					WriteWidthsItem(allWidthsSame,widthsList,firstCIDInList,previousCIDInList);
					widthsList.clear();
					widthsList.push_back(currentWidth);
					allWidthsSame = true;
					firstCIDInList = it->second.mEncodedCharacter;
					previousCIDInList = it->second.mEncodedCharacter;
				}

			}
			
		}
		if(widthsList.size() > 0)
			WriteWidthsItem(allWidthsSame,widthsList,firstCIDInList,previousCIDInList);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
	}
}